

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O1

result<long,_toml::error_info> *
toml::read_hex_int<long>
          (result<long,_toml::error_info> *__return_storage_ptr__,string *str,source_location *src)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  long val;
  string __str_1;
  string __str;
  istringstream iss;
  string local_360;
  string local_340;
  value_type_conflict4 local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  error_info local_2d8;
  source_location local_280;
  long local_208 [3];
  uint auStack_1f0 [2];
  byte abStack_1e8 [88];
  ios_base local_190 [264];
  failure<toml::error_info> local_88;
  
  local_320 = 0;
  std::__cxx11::istringstream::istringstream((istringstream *)local_208,(string *)str,_S_in);
  *(uint *)((long)auStack_1f0 + *(long *)(local_208[0] + -0x18)) =
       *(uint *)((long)auStack_1f0 + *(long *)(local_208[0] + -0x18)) & 0xffffffb5 | 8;
  std::istream::_M_extract<long>(local_208);
  if ((abStack_1e8[*(long *)(local_208[0] + -0x18)] & 5) == 0) {
    __return_storage_ptr__->is_ok_ = true;
    (__return_storage_ptr__->field_1).succ_.value = local_320;
  }
  else {
    local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              (&local_2f8,2,'-');
    pcVar1 = local_2f8._M_dataplus._M_p;
    pcVar1[0] = '6';
    pcVar1[1] = '3';
    pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_2f8,0,0,
                     "toml::parse_hex_integer: too large integer: current max value = 2^",0x42);
    local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
    paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar2->_M_dataplus)._M_p;
    paVar3 = &pbVar2->field_2;
    if (paVar4 == paVar3) {
      local_360.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
      local_360.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
    }
    else {
      local_360.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
      local_360._M_dataplus._M_p = (pointer)paVar4;
    }
    local_360._M_string_length = pbVar2->_M_string_length;
    (pbVar2->_M_dataplus)._M_p = (pointer)paVar3;
    pbVar2->_M_string_length = 0;
    (pbVar2->field_2)._M_local_buf[0] = '\0';
    source_location::source_location(&local_280,src);
    local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              (&local_318,2,'-');
    pcVar1 = local_318._M_dataplus._M_p;
    pcVar1[0] = '6';
    pcVar1[1] = '3';
    pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_318,0,0,"must be < 2^",0xc);
    local_340._M_dataplus._M_p = (pbVar2->_M_dataplus)._M_p;
    paVar4 = &pbVar2->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p == paVar4) {
      local_340.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_340.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
      local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
    }
    else {
      local_340.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    }
    local_340._M_string_length = pbVar2->_M_string_length;
    (pbVar2->_M_dataplus)._M_p = (pointer)paVar4;
    pbVar2->_M_string_length = 0;
    (pbVar2->field_2)._M_local_buf[0] = '\0';
    make_error_info<>(&local_2d8,&local_360,&local_280,&local_340);
    err<toml::error_info>(&local_88,&local_2d8);
    __return_storage_ptr__->is_ok_ = false;
    failure<toml::error_info>::failure
              ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_88);
    failure<toml::error_info>::~failure(&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8.suffix_._M_dataplus._M_p != &local_2d8.suffix_.field_2) {
      operator_delete(local_2d8.suffix_._M_dataplus._M_p,
                      local_2d8.suffix_.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_2d8.locations_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8.title_._M_dataplus._M_p != &local_2d8.title_.field_2) {
      operator_delete(local_2d8.title_._M_dataplus._M_p,
                      local_2d8.title_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != &local_318.field_2) {
      operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
    }
    source_location::~source_location(&local_280);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)local_208);
  std::ios_base::~ios_base(local_190);
  return __return_storage_ptr__;
}

Assistant:

result<T, error_info>
read_hex_int(const std::string& str, const source_location src)
{
    constexpr auto max_digits = std::numeric_limits<T>::digits;
    assert( ! str.empty());

    T val{0};
    std::istringstream iss(str);
    iss >> std::hex >> val;
    if(iss.fail())
    {
        return err(make_error_info("toml::parse_hex_integer: "
            "too large integer: current max value = 2^" + std::to_string(max_digits),
            std::move(src), "must be < 2^" + std::to_string(max_digits)));
    }
    return ok(val);
}